

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

void Extra_bddPermuteArray
               (DdManager *manager,DdNode **bNodesIn,DdNode **bNodesOut,int nNodes,int *permut)

{
  DdHashTable *table_00;
  DdNode *pDVar1;
  int local_40;
  int local_3c;
  int k;
  int i;
  DdHashTable *table;
  int *permut_local;
  int nNodes_local;
  DdNode **bNodesOut_local;
  DdNode **bNodesIn_local;
  DdManager *manager_local;
  
  do {
    manager->reordered = 0;
    table_00 = cuddHashTableInit(manager,1,2);
    local_3c = 0;
    while( true ) {
      if (nNodes <= local_3c) goto LAB_00a8a856;
      pDVar1 = cuddBddPermuteRecur(manager,table_00,bNodesIn[local_3c],permut);
      bNodesOut[local_3c] = pDVar1;
      if (bNodesOut[local_3c] == (DdNode *)0x0) break;
      *(int *)(((ulong)bNodesOut[local_3c] & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)bNodesOut[local_3c] & 0xfffffffffffffffe) + 4) + 1;
      local_3c = local_3c + 1;
    }
    for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
      Cudd_RecursiveDeref(manager,bNodesOut[local_40]);
    }
LAB_00a8a856:
    cuddHashTableQuit(table_00);
    if (manager->reordered != 1) {
      return;
    }
  } while( true );
}

Assistant:

void Extra_bddPermuteArray( DdManager * manager, DdNode ** bNodesIn, DdNode ** bNodesOut, int nNodes, int *permut )
{
    DdHashTable *table;
    int i, k;
    do
    {
        manager->reordered = 0;
        table = cuddHashTableInit( manager, 1, 2 );

        /* permute the output functions one-by-one */
        for ( i = 0; i < nNodes; i++ )
        {
            bNodesOut[i] = cuddBddPermuteRecur( manager, table, bNodesIn[i], permut );
            if ( bNodesOut[i] == NULL )
            {
                /* deref the array of the already computed outputs */
                for ( k = 0; k < i; k++ )
                    Cudd_RecursiveDeref( manager, bNodesOut[k] );
                break;
            }
            cuddRef( bNodesOut[i] );
        }
        /* Dispose of local cache. */
        cuddHashTableQuit( table );
    }
    while ( manager->reordered == 1 );
}